

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall geometrycentral::surface::SurfaceMesh::compressVertices(SurfaceMesh *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  allocator_type *__a;
  SurfaceMesh *this_01;
  _List_node_base *p_Var1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _func_int **local_50;
  pointer local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __a = (allocator_type *)&stack0xffffffffffffffb0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffc8,
             this->nVerticesFillCount,&INVALID_IND,__a);
  this_00 = &this->vHalfedgeArr;
  for (local_50 = (_func_int **)0x0; local_50 < (_func_int **)this->nVerticesFillCount;
      local_50 = (_func_int **)((long)local_50 + 1)) {
    __a = (allocator_type *)
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start;
    if (*(long *)(__a + (long)local_50 * 8) != -1) {
      __a = (allocator_type *)
            ((long)local_68._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3);
      local_38[(long)local_50] = (unsigned_long)__a;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
                 (value_type_conflict1 *)&stack0xffffffffffffffb0);
    }
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb0,
             (geometrycentral *)this_00,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  this_01 = (SurfaceMesh *)&stack0xffffffffffffffb0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(this_00,this_01);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  if (this->useImplicitTwinFlag == false) {
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb0,
               (geometrycentral *)&this->vHeInStartArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->vHeInStartArr,
               (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffffb0);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffffb0);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb0,
               (geometrycentral *)&this->vHeOutStartArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    this_01 = (SurfaceMesh *)&stack0xffffffffffffffb0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->vHeOutStartArr,this_01);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  }
  updateValues(this_01,&this->heVertexArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffc8);
  this->nVerticesFillCount = this->nVerticesCount;
  this->nVerticesCapacityCount = this->nVerticesCount;
  p_Var1 = (_List_node_base *)&this->vertexPermuteCallbackList;
  while (p_Var1 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->vertexPermuteCallbackList) {
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                *)(p_Var1 + 1),(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68);
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffc8
            );
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void SurfaceMesh::compressVertices() {
  // Build the compressing shift
  std::vector<size_t> newIndMap;                                  // maps new ind -> old ind
  std::vector<size_t> oldIndMap(nVerticesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nVerticesFillCount; i++) {
    if (!vertexIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);
    }
  }


  // Permute & resize all per-vertex arrays
  vHalfedgeArr = applyPermutation(vHalfedgeArr, newIndMap);
  if (!usesImplicitTwin()) {
    vHeInStartArr = applyPermutation(vHeInStartArr, newIndMap);
    vHeOutStartArr = applyPermutation(vHeOutStartArr, newIndMap);
  }

  // Update indices in all vertex-valued arrays
  updateValues(heVertexArr, oldIndMap);

  // Update counts
  nVerticesFillCount = nVerticesCount;
  nVerticesCapacityCount = nVerticesCount;

  // Invoke callbacks
  for (auto& f : vertexPermuteCallbackList) {
    f(newIndMap);
  }
}